

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  vint4 bi_2;
  undefined1 auVar27 [64];
  vint4 bi_4;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_3;
  undefined1 auVar38 [16];
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai_4;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  vint4 bi_5;
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  vint4 bi;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10f8 [16];
  Intersectors *local_10e8;
  size_t local_10e0;
  Precalculations *local_10d8;
  RayHitK<4> *local_10d0;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10d8 = pre;
  local_10e8 = This;
  pauVar18 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_1008 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1018._4_4_ = fVar1;
  local_1018._0_4_ = fVar1;
  local_1018._8_4_ = fVar1;
  local_1018._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1028._4_4_ = fVar2;
  local_1028._0_4_ = fVar2;
  local_1028._8_4_ = fVar2;
  local_1028._12_4_ = fVar2;
  local_1038 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_1034 = local_1038;
  uStack_1030 = local_1038;
  uStack_102c = local_1038;
  local_1048 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_1044 = local_1048;
  uStack_1040 = local_1048;
  uStack_103c = local_1048;
  local_1058 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1068._4_4_ = fVar3;
  local_1068._0_4_ = fVar3;
  local_1068._8_4_ = fVar3;
  local_1068._12_4_ = fVar3;
  auVar46 = ZEXT1664(local_1068);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1078._4_4_ = fVar4;
  local_1078._0_4_ = fVar4;
  local_1078._8_4_ = fVar4;
  local_1078._12_4_ = fVar4;
  auVar47 = ZEXT1664(local_1078);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1088._4_4_ = fVar5;
  local_1088._0_4_ = fVar5;
  local_1088._8_4_ = fVar5;
  local_1088._12_4_ = fVar5;
  auVar49 = ZEXT1664(local_1088);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar6 = (tray->tnear).field_0.i[k];
  local_1098._4_4_ = iVar6;
  local_1098._0_4_ = iVar6;
  local_1098._8_4_ = iVar6;
  local_1098._12_4_ = iVar6;
  auVar50 = ZEXT1664(local_1098);
  iVar6 = (tray->tfar).field_0.i[k];
  auVar27 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_10a8._0_4_ = fVar3 * -local_1008;
  local_10a8._4_4_ = fVar3 * -local_1008;
  local_10a8._8_4_ = fVar3 * -local_1008;
  local_10a8._12_4_ = fVar3 * -local_1008;
  auVar52 = ZEXT1664(local_10a8);
  local_10b8._0_4_ = fVar4 * -fVar1;
  local_10b8._4_4_ = fVar4 * -fVar1;
  local_10b8._8_4_ = fVar4 * -fVar1;
  local_10b8._12_4_ = fVar4 * -fVar1;
  auVar54 = ZEXT1664(local_10b8);
  local_10c8._0_4_ = fVar5 * -fVar2;
  local_10c8._4_4_ = fVar5 * -fVar2;
  local_10c8._8_4_ = fVar5 * -fVar2;
  local_10c8._12_4_ = fVar5 * -fVar2;
  auVar55 = ZEXT1664(local_10c8);
  local_10d0 = ray;
  local_10e0 = k;
  do {
    pauVar17 = pauVar18 + -1;
    pauVar18 = pauVar18 + -1;
    if (*(float *)(*pauVar17 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar21 = *(ulong *)*pauVar18;
      while ((uVar21 & 8) == 0) {
        fVar1 = *(float *)(ray + k * 4 + 0x70);
        uVar20 = (uint)uVar21 & 7;
        uVar19 = uVar21 & 0xfffffffffffffff0;
        if (uVar20 == 3) {
          local_fd8 = *(undefined1 (*) [16])(uVar19 + 0x20);
          local_fc8 = *(undefined1 (*) [16])(uVar19 + 0x30);
          local_ff8 = *(undefined1 (*) [16])(uVar19 + 0x50);
          local_fe8 = *(undefined1 (*) [16])(uVar19 + 0x60);
          auVar29 = *(undefined1 (*) [16])(uVar19 + 0x80);
          auVar12 = *(undefined1 (*) [16])(uVar19 + 0x90);
          fStack_f8c = 1.0 - fVar1;
          auVar30._4_4_ = fStack_f8c;
          auVar30._0_4_ = fStack_f8c;
          auVar30._8_4_ = fStack_f8c;
          auVar30._12_4_ = fStack_f8c;
          auVar51._0_4_ = fVar1 * *(float *)(uVar19 + 0xe0);
          auVar51._4_4_ = fVar1 * *(float *)(uVar19 + 0xe4);
          auVar51._8_4_ = fVar1 * *(float *)(uVar19 + 0xe8);
          auVar51._12_4_ = fVar1 * *(float *)(uVar19 + 0xec);
          auVar53._0_4_ = fVar1 * *(float *)(uVar19 + 0xf0);
          auVar53._4_4_ = fVar1 * *(float *)(uVar19 + 0xf4);
          auVar53._8_4_ = fVar1 * *(float *)(uVar19 + 0xf8);
          auVar53._12_4_ = fVar1 * *(float *)(uVar19 + 0xfc);
          auVar45._0_4_ = fVar1 * *(float *)(uVar19 + 0x100);
          auVar45._4_4_ = fVar1 * *(float *)(uVar19 + 0x104);
          auVar45._8_4_ = fVar1 * *(float *)(uVar19 + 0x108);
          auVar45._12_4_ = fVar1 * *(float *)(uVar19 + 0x10c);
          auVar31 = ZEXT816(0) << 0x40;
          auVar14 = vfmadd231ps_fma(auVar51,auVar30,auVar31);
          auVar15 = vfmadd231ps_fma(auVar53,auVar30,auVar31);
          local_f88 = vfmadd231ps_fma(auVar45,auVar30,auVar31);
          local_fb8 = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x110);
          fStack_fb4 = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x114);
          fStack_fb0 = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x118);
          fStack_fac = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x11c);
          local_fa8 = fVar1 * *(float *)(uVar19 + 0x120) + fStack_f8c;
          fStack_fa4 = fVar1 * *(float *)(uVar19 + 0x124) + fStack_f8c;
          fStack_fa0 = fVar1 * *(float *)(uVar19 + 0x128) + fStack_f8c;
          fStack_f9c = fVar1 * *(float *)(uVar19 + 300) + fStack_f8c;
          local_f98 = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x130);
          fStack_f94 = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x134);
          fStack_f90 = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x138);
          fStack_f8c = fStack_f8c + fVar1 * *(float *)(uVar19 + 0x13c);
          auVar31._0_4_ = local_1058 * auVar29._0_4_;
          auVar31._4_4_ = fStack_1054 * auVar29._4_4_;
          auVar31._8_4_ = fStack_1050 * auVar29._8_4_;
          auVar31._12_4_ = fStack_104c * auVar29._12_4_;
          auVar39._0_4_ = local_1058 * auVar12._0_4_;
          auVar39._4_4_ = fStack_1054 * auVar12._4_4_;
          auVar39._8_4_ = fStack_1050 * auVar12._8_4_;
          auVar39._12_4_ = fStack_104c * auVar12._12_4_;
          auVar16._4_4_ = uStack_1044;
          auVar16._0_4_ = local_1048;
          auVar16._8_4_ = uStack_1040;
          auVar16._12_4_ = uStack_103c;
          auVar30 = vfmadd231ps_fma(auVar31,auVar16,local_ff8);
          auVar31 = vfmadd231ps_fma(auVar39,auVar16,local_fe8);
          auVar11._4_4_ = uStack_1034;
          auVar11._0_4_ = local_1038;
          auVar11._8_4_ = uStack_1030;
          auVar11._12_4_ = uStack_102c;
          auVar13 = vfmadd231ps_fma(auVar30,auVar11,local_fd8);
          auVar31 = vfmadd231ps_fma(auVar31,auVar11,local_fc8);
          auVar35._8_4_ = 0x7fffffff;
          auVar35._0_8_ = 0x7fffffff7fffffff;
          auVar35._12_4_ = 0x7fffffff;
          auVar30 = vandps_avx(auVar13,auVar35);
          auVar41._8_4_ = 0x219392ef;
          auVar41._0_8_ = 0x219392ef219392ef;
          auVar41._12_4_ = 0x219392ef;
          auVar30 = vcmpps_avx(auVar30,auVar41,1);
          auVar13 = vblendvps_avx(auVar13,auVar41,auVar30);
          auVar30 = vandps_avx(auVar31,auVar35);
          auVar30 = vcmpps_avx(auVar30,auVar41,1);
          auVar39 = vblendvps_avx(auVar31,auVar41,auVar30);
          auVar30 = *(undefined1 (*) [16])(uVar19 + 0xa0);
          auVar32._0_4_ = local_1058 * auVar30._0_4_;
          auVar32._4_4_ = fStack_1054 * auVar30._4_4_;
          auVar32._8_4_ = fStack_1050 * auVar30._8_4_;
          auVar32._12_4_ = fStack_104c * auVar30._12_4_;
          auVar31 = vfmadd231ps_fma(auVar32,auVar16,*(undefined1 (*) [16])(uVar19 + 0x70));
          auVar16 = vfmadd231ps_fma(auVar31,auVar11,*(undefined1 (*) [16])(uVar19 + 0x40));
          auVar31 = vandps_avx(auVar16,auVar35);
          auVar31 = vcmpps_avx(auVar31,auVar41,1);
          auVar31 = vblendvps_avx(auVar16,auVar41,auVar31);
          auVar16 = vrcpps_avx(auVar13);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar13 = vfnmadd213ps_fma(auVar13,auVar16,auVar33);
          auVar16 = vfmadd132ps_fma(auVar13,auVar16,auVar16);
          auVar13 = vrcpps_avx(auVar39);
          auVar39 = vfnmadd213ps_fma(auVar39,auVar13,auVar33);
          auVar11 = vfmadd132ps_fma(auVar39,auVar13,auVar13);
          auVar13 = vrcpps_avx(auVar31);
          auVar31 = vfnmadd213ps_fma(auVar31,auVar13,auVar33);
          auVar32 = vfmadd132ps_fma(auVar31,auVar13,auVar13);
          auVar29 = vfmadd213ps_fma(auVar29,local_1028,*(undefined1 (*) [16])(uVar19 + 0xb0));
          auVar31 = vfmadd231ps_fma(auVar29,local_1018,local_ff8);
          auVar29 = vfmadd213ps_fma(auVar12,local_1028,*(undefined1 (*) [16])(uVar19 + 0xc0));
          auVar12 = vfmadd213ps_fma(auVar30,local_1028,*(undefined1 (*) [16])(uVar19 + 0xd0));
          auVar29 = vfmadd231ps_fma(auVar29,local_1018,local_fe8);
          auVar12 = vfmadd231ps_fma(auVar12,local_1018,*(undefined1 (*) [16])(uVar19 + 0x70));
          auVar13._4_4_ = fStack_1004;
          auVar13._0_4_ = local_1008;
          auVar13._8_4_ = fStack_1000;
          auVar13._12_4_ = fStack_ffc;
          auVar30 = vfmadd231ps_fma(auVar31,auVar13,local_fd8);
          auVar31 = vfmadd231ps_fma(auVar29,auVar13,local_fc8);
          auVar39 = vfmadd231ps_fma(auVar12,auVar13,*(undefined1 (*) [16])(uVar19 + 0x40));
          auVar29 = vsubps_avx(auVar14,auVar30);
          auVar50 = ZEXT1664(local_1098);
          auVar12._4_4_ = fStack_fb4;
          auVar12._0_4_ = local_fb8;
          auVar12._8_4_ = fStack_fb0;
          auVar12._12_4_ = fStack_fac;
          auVar12 = vsubps_avx(auVar12,auVar30);
          auVar30 = vsubps_avx(auVar15,auVar31);
          auVar52 = ZEXT1664(local_10a8);
          auVar14._4_4_ = fStack_fa4;
          auVar14._0_4_ = local_fa8;
          auVar14._8_4_ = fStack_fa0;
          auVar14._12_4_ = fStack_f9c;
          auVar31 = vsubps_avx(auVar14,auVar31);
          auVar13 = vsubps_avx(local_f88,auVar39);
          auVar54 = ZEXT1664(local_10b8);
          auVar15._4_4_ = fStack_f94;
          auVar15._0_4_ = local_f98;
          auVar15._8_4_ = fStack_f90;
          auVar15._12_4_ = fStack_f8c;
          auVar39 = vsubps_avx(auVar15,auVar39);
          auVar36._0_4_ = auVar16._0_4_ * auVar29._0_4_;
          auVar36._4_4_ = auVar16._4_4_ * auVar29._4_4_;
          auVar36._8_4_ = auVar16._8_4_ * auVar29._8_4_;
          auVar36._12_4_ = auVar16._12_4_ * auVar29._12_4_;
          auVar48._0_4_ = auVar16._0_4_ * auVar12._0_4_;
          auVar48._4_4_ = auVar16._4_4_ * auVar12._4_4_;
          auVar48._8_4_ = auVar16._8_4_ * auVar12._8_4_;
          auVar48._12_4_ = auVar16._12_4_ * auVar12._12_4_;
          auVar55 = ZEXT1664(local_10c8);
          auVar40._0_4_ = auVar11._0_4_ * auVar30._0_4_;
          auVar40._4_4_ = auVar11._4_4_ * auVar30._4_4_;
          auVar40._8_4_ = auVar11._8_4_ * auVar30._8_4_;
          auVar40._12_4_ = auVar11._12_4_ * auVar30._12_4_;
          auVar44._0_4_ = auVar13._0_4_ * auVar32._0_4_;
          auVar44._4_4_ = auVar13._4_4_ * auVar32._4_4_;
          auVar44._8_4_ = auVar13._8_4_ * auVar32._8_4_;
          auVar44._12_4_ = auVar13._12_4_ * auVar32._12_4_;
          auVar42._0_4_ = auVar11._0_4_ * auVar31._0_4_;
          auVar42._4_4_ = auVar11._4_4_ * auVar31._4_4_;
          auVar42._8_4_ = auVar11._8_4_ * auVar31._8_4_;
          auVar42._12_4_ = auVar11._12_4_ * auVar31._12_4_;
          auVar34._0_4_ = auVar39._0_4_ * auVar32._0_4_;
          auVar34._4_4_ = auVar39._4_4_ * auVar32._4_4_;
          auVar34._8_4_ = auVar39._8_4_ * auVar32._8_4_;
          auVar34._12_4_ = auVar39._12_4_ * auVar32._12_4_;
          auVar29 = vpminsd_avx(auVar40,auVar42);
          auVar12 = vpminsd_avx(auVar44,auVar34);
          auVar29 = vmaxps_avx(auVar29,auVar12);
          auVar13 = vpminsd_avx(auVar36,auVar48);
          auVar31 = vpmaxsd_avx(auVar36,auVar48);
          auVar49 = ZEXT1664(local_1088);
          auVar12 = vpmaxsd_avx(auVar40,auVar42);
          auVar30 = vpmaxsd_avx(auVar44,auVar34);
          auVar30 = vminps_avx(auVar12,auVar30);
          auVar12 = vmaxps_avx(local_1098,auVar13);
          auVar47 = ZEXT1664(local_1078);
          local_10f8 = vmaxps_avx(auVar12,auVar29);
          auVar46 = ZEXT1664(local_1068);
          auVar29 = vminps_avx(auVar27._0_16_,auVar31);
          auVar29 = vminps_avx(auVar29,auVar30);
          auVar29 = vcmpps_avx(local_10f8,auVar29,2);
          uVar20 = vmovmskps_avx(auVar29);
        }
        else {
          auVar28._4_4_ = fVar1;
          auVar28._0_4_ = fVar1;
          auVar28._8_4_ = fVar1;
          auVar28._12_4_ = fVar1;
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar25),auVar28,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + uVar25));
          auVar29 = vfmadd213ps_fma(auVar29,auVar46._0_16_,auVar52._0_16_);
          auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + uVar23));
          auVar12 = vfmadd213ps_fma(auVar12,auVar47._0_16_,auVar54._0_16_);
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar26),auVar28,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + uVar26));
          auVar29 = vpmaxsd_avx(auVar29,auVar12);
          auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar25 ^ 0x10)),auVar28,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar25 ^ 0x10)));
          auVar31 = vfmadd213ps_fma(auVar30,auVar49._0_16_,auVar55._0_16_);
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar23 ^ 0x10)),auVar28,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar23 ^ 0x10)));
          auVar12 = vfmadd213ps_fma(auVar12,auVar46._0_16_,auVar52._0_16_);
          auVar30 = vfmadd213ps_fma(auVar30,auVar47._0_16_,auVar54._0_16_);
          auVar30 = vpminsd_avx(auVar12,auVar30);
          auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar26 ^ 0x10)),auVar28,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar26 ^ 0x10)));
          auVar13 = vfmadd213ps_fma(auVar12,auVar49._0_16_,auVar55._0_16_);
          auVar12 = vpmaxsd_avx(auVar31,auVar50._0_16_);
          local_10f8 = vpmaxsd_avx(auVar29,auVar12);
          auVar29 = vpminsd_avx(auVar13,auVar27._0_16_);
          auVar29 = vpminsd_avx(auVar30,auVar29);
          if (uVar20 == 6) {
            auVar12 = vcmpps_avx(local_10f8,auVar29,2);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar19 + 0xe0),auVar28,2);
            auVar30 = vcmpps_avx(auVar28,*(undefined1 (*) [16])(uVar19 + 0xf0),1);
            auVar29 = vandps_avx(auVar29,auVar30);
            auVar29 = vandps_avx(auVar29,auVar12);
          }
          else {
            auVar29 = vcmpps_avx(local_10f8,auVar29,2);
          }
          auVar29 = vpslld_avx(auVar29,0x1f);
          uVar20 = vmovmskps_avx(auVar29);
        }
        uVar21 = (ulong)uVar20;
        if (uVar21 == 0) goto LAB_00522bcf;
        lVar10 = 0;
        for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
          lVar10 = lVar10 + 1;
        }
        uVar20 = uVar20 - 1 & uVar20;
        uVar22 = (ulong)uVar20;
        uVar21 = *(ulong *)(uVar19 + lVar10 * 8);
        if (uVar20 != 0) {
          uVar8 = *(uint *)(local_10f8 + lVar10 * 4);
          lVar10 = 0;
          for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar20 = uVar20 - 1 & uVar20;
          uVar24 = (ulong)uVar20;
          uVar22 = *(ulong *)(uVar19 + lVar10 * 8);
          uVar9 = *(uint *)(local_10f8 + lVar10 * 4);
          if (uVar20 == 0) {
            if (uVar8 < uVar9) {
              *(ulong *)*pauVar18 = uVar22;
              *(uint *)(*pauVar18 + 8) = uVar9;
              pauVar18 = pauVar18 + 1;
            }
            else {
              *(ulong *)*pauVar18 = uVar21;
              *(uint *)(*pauVar18 + 8) = uVar8;
              pauVar18 = pauVar18 + 1;
              uVar21 = uVar22;
            }
          }
          else {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar21;
            auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar8));
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar22;
            auVar12 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar9));
            lVar10 = 0;
            for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar10 = lVar10 + 1;
            }
            uVar20 = uVar20 - 1 & uVar20;
            uVar21 = (ulong)uVar20;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)(uVar19 + lVar10 * 8);
            auVar31 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_10f8 + lVar10 * 4)));
            auVar30 = vpcmpgtd_avx(auVar12,auVar29);
            if (uVar20 == 0) {
              auVar13 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar12,auVar29,auVar13);
              auVar29 = vblendvps_avx(auVar29,auVar12,auVar13);
              auVar12 = vpcmpgtd_avx(auVar31,auVar30);
              auVar13 = vpshufd_avx(auVar12,0xaa);
              auVar12 = vblendvps_avx(auVar31,auVar30,auVar13);
              auVar30 = vblendvps_avx(auVar30,auVar31,auVar13);
              auVar31 = vpcmpgtd_avx(auVar30,auVar29);
              auVar13 = vpshufd_avx(auVar31,0xaa);
              auVar31 = vblendvps_avx(auVar30,auVar29,auVar13);
              auVar29 = vblendvps_avx(auVar29,auVar30,auVar13);
              *pauVar18 = auVar29;
              pauVar18[1] = auVar31;
              uVar21 = auVar12._0_8_;
              pauVar18 = pauVar18 + 2;
            }
            else {
              lVar10 = 0;
              for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar10 = lVar10 + 1;
              }
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(uVar19 + lVar10 * 8);
              auVar39 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_10f8 + lVar10 * 4)));
              auVar13 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar12,auVar29,auVar13);
              auVar29 = vblendvps_avx(auVar29,auVar12,auVar13);
              auVar12 = vpcmpgtd_avx(auVar39,auVar31);
              auVar13 = vpshufd_avx(auVar12,0xaa);
              auVar12 = vblendvps_avx(auVar39,auVar31,auVar13);
              auVar31 = vblendvps_avx(auVar31,auVar39,auVar13);
              auVar13 = vpcmpgtd_avx(auVar31,auVar29);
              auVar39 = vpshufd_avx(auVar13,0xaa);
              auVar13 = vblendvps_avx(auVar31,auVar29,auVar39);
              auVar29 = vblendvps_avx(auVar29,auVar31,auVar39);
              auVar31 = vpcmpgtd_avx(auVar12,auVar30);
              auVar39 = vpshufd_avx(auVar31,0xaa);
              auVar31 = vblendvps_avx(auVar12,auVar30,auVar39);
              auVar12 = vblendvps_avx(auVar30,auVar12,auVar39);
              auVar30 = vpcmpgtd_avx(auVar13,auVar12);
              auVar39 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar13,auVar12,auVar39);
              auVar12 = vblendvps_avx(auVar12,auVar13,auVar39);
              *pauVar18 = auVar29;
              pauVar18[1] = auVar12;
              pauVar18[2] = auVar30;
              uVar21 = auVar31._0_8_;
              pauVar18 = pauVar18 + 3;
            }
          }
        }
      }
      (**(code **)((long)local_10e8->leafIntersector +
                  (ulong)*(byte *)(uVar21 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_10d8,ray,k,context);
      auVar55 = ZEXT1664(local_10c8);
      auVar54 = ZEXT1664(local_10b8);
      auVar52 = ZEXT1664(local_10a8);
      auVar50 = ZEXT1664(local_1098);
      auVar49 = ZEXT1664(local_1088);
      auVar47 = ZEXT1664(local_1078);
      auVar46 = ZEXT1664(local_1068);
      uVar7 = *(undefined4 *)(local_10d0 + local_10e0 * 4 + 0x80);
      auVar27 = ZEXT1664(CONCAT412(uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7))));
      ray = local_10d0;
      k = local_10e0;
    }
LAB_00522bcf:
    if (pauVar18 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }